

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O2

void Omega_h::map_into<long>(Read<long> *a_data,Graph *a2b,Write<long> *b_data,Int width)

{
  Read<long> ab_data;
  Write<int> local_80;
  Write<int> local_70;
  Write<int> local_60;
  Write<int> local_50;
  Write<int> local_40;
  Write<int> local_30;
  
  Write<long>::Write(&local_40,(Write<int> *)a_data);
  Write<int>::Write(&local_50,(Write<int> *)a2b);
  expand<long>((Omega_h *)&local_30,(Read<signed_char> *)&local_40,(LOs *)&local_50,width);
  Write<int>::~Write(&local_50);
  Write<long>::~Write((Write<long> *)&local_40);
  Write<long>::Write(&local_60,&local_30);
  Write<int>::Write(&local_70,&(a2b->ab2b).write_);
  Write<long>::Write(&local_80,(Write<int> *)b_data);
  map_into<long>((Read<signed_char> *)&local_60,(LOs *)&local_70,(Write<signed_char> *)&local_80,
                 width);
  Write<long>::~Write((Write<long> *)&local_80);
  Write<int>::~Write(&local_70);
  Write<long>::~Write((Write<long> *)&local_60);
  Write<long>::~Write((Write<long> *)&local_30);
  return;
}

Assistant:

void map_into(Read<T> a_data, Graph a2b, Write<T> b_data, Int width) {
  auto ab_data = expand(a_data, a2b.a2ab, width);
  map_into(ab_data, a2b.ab2b, b_data, width);
}